

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::btSoftBody(btSoftBody *this,btSoftBodyWorldInfo *worldInfo)

{
  btCollisionObject::btCollisionObject(&this->super_btCollisionObject);
  (this->super_btCollisionObject)._vptr_btCollisionObject = (_func_int **)&PTR__btSoftBody_00229238;
  (this->m_collisionDisabledObjects).m_ownsMemory = true;
  (this->m_collisionDisabledObjects).m_data = (btCollisionObject **)0x0;
  (this->m_collisionDisabledObjects).m_size = 0;
  (this->m_collisionDisabledObjects).m_capacity = 0;
  (this->m_cfg).m_vsequence.m_ownsMemory = true;
  (this->m_cfg).m_vsequence.m_data = (_ *)0x0;
  (this->m_cfg).m_vsequence.m_size = 0;
  (this->m_cfg).m_vsequence.m_capacity = 0;
  (this->m_cfg).m_psequence.m_ownsMemory = true;
  (this->m_cfg).m_psequence.m_data = (_ *)0x0;
  (this->m_cfg).m_psequence.m_size = 0;
  (this->m_cfg).m_psequence.m_capacity = 0;
  (this->m_cfg).m_dsequence.m_ownsMemory = true;
  (this->m_cfg).m_dsequence.m_data = (_ *)0x0;
  (this->m_cfg).m_dsequence.m_size = 0;
  (this->m_cfg).m_dsequence.m_capacity = 0;
  (this->m_pose).m_pos.m_ownsMemory = true;
  (this->m_pose).m_pos.m_data = (btVector3 *)0x0;
  (this->m_pose).m_pos.m_size = 0;
  (this->m_pose).m_pos.m_capacity = 0;
  (this->m_pose).m_wgh.m_ownsMemory = true;
  (this->m_pose).m_wgh.m_data = (float *)0x0;
  (this->m_pose).m_wgh.m_size = 0;
  (this->m_pose).m_wgh.m_capacity = 0;
  this->m_worldInfo = worldInfo;
  (this->m_notes).m_ownsMemory = true;
  (this->m_notes).m_data = (Note *)0x0;
  (this->m_notes).m_size = 0;
  (this->m_notes).m_capacity = 0;
  (this->m_nodes).m_ownsMemory = true;
  (this->m_nodes).m_data = (Node *)0x0;
  (this->m_nodes).m_size = 0;
  (this->m_nodes).m_capacity = 0;
  (this->m_links).m_ownsMemory = true;
  (this->m_links).m_data = (Link *)0x0;
  (this->m_links).m_size = 0;
  (this->m_links).m_capacity = 0;
  (this->m_faces).m_ownsMemory = true;
  (this->m_faces).m_data = (Face *)0x0;
  (this->m_faces).m_size = 0;
  (this->m_faces).m_capacity = 0;
  (this->m_tetras).m_ownsMemory = true;
  (this->m_tetras).m_data = (Tetra *)0x0;
  (this->m_tetras).m_size = 0;
  (this->m_tetras).m_capacity = 0;
  (this->m_anchors).m_ownsMemory = true;
  (this->m_anchors).m_data = (Anchor *)0x0;
  (this->m_anchors).m_size = 0;
  (this->m_anchors).m_capacity = 0;
  (this->m_rcontacts).m_ownsMemory = true;
  (this->m_rcontacts).m_data = (RContact *)0x0;
  (this->m_rcontacts).m_size = 0;
  (this->m_rcontacts).m_capacity = 0;
  (this->m_scontacts).m_ownsMemory = true;
  (this->m_scontacts).m_data = (SContact *)0x0;
  (this->m_scontacts).m_size = 0;
  (this->m_scontacts).m_capacity = 0;
  (this->m_joints).m_ownsMemory = true;
  (this->m_joints).m_data = (Joint **)0x0;
  (this->m_joints).m_size = 0;
  (this->m_joints).m_capacity = 0;
  (this->m_materials).m_ownsMemory = true;
  (this->m_materials).m_data = (Material **)0x0;
  (this->m_materials).m_size = 0;
  (this->m_materials).m_capacity = 0;
  btDbvt::btDbvt(&this->m_ndbvt);
  btDbvt::btDbvt(&this->m_fdbvt);
  btDbvt::btDbvt(&this->m_cdbvt);
  (this->m_clusters).m_ownsMemory = true;
  (this->m_clusters).m_data = (Cluster **)0x0;
  (this->m_clusters).m_size = 0;
  (this->m_clusters).m_capacity = 0;
  (this->m_clusterConnectivity).m_ownsMemory = true;
  (this->m_clusterConnectivity).m_data = (bool *)0x0;
  (this->m_clusterConnectivity).m_size = 0;
  (this->m_clusterConnectivity).m_capacity = 0;
  (this->m_userIndexMapping).m_ownsMemory = true;
  (this->m_userIndexMapping).m_data = (int *)0x0;
  (this->m_userIndexMapping).m_size = 0;
  (this->m_userIndexMapping).m_capacity = 0;
  initDefaults(this);
  return;
}

Assistant:

btSoftBody::btSoftBody(btSoftBodyWorldInfo*	worldInfo)
:m_worldInfo(worldInfo)
{
	initDefaults();
}